

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_text.c
# Opt level: O1

void * text_delete_new(t_symbol *s,int argc,t_atom *argv)

{
  int argc_00;
  t_text_client *x;
  t_atom *local_30;
  int local_24;
  
  local_30 = argv;
  local_24 = argc;
  x = (t_text_client *)pd_new(text_delete_class);
  text_client_argparse(x,&local_24,&local_30,"text delete");
  argc_00 = local_24;
  if (local_24 != 0) {
    post("warning: text delete ignoring extra argument: ");
    postatom(argc_00,local_30);
    endpost();
  }
  if (x->tc_struct == (t_symbol *)0x0) {
    symbolinlet_new((t_object *)x,&x->tc_sym);
  }
  else {
    pointerinlet_new((t_object *)x,&x->tc_gp);
  }
  return x;
}

Assistant:

static void *text_delete_new(t_symbol *s, int argc, t_atom *argv)
{
    t_text_delete *x = (t_text_delete *)pd_new(text_delete_class);
    text_client_argparse(&x->x_tc, &argc, &argv, "text delete");
    if (argc)
    {
        post("warning: text delete ignoring extra argument: ");
        postatom(argc, argv); endpost();
    }
    if (x->x_struct)
        pointerinlet_new(&x->x_obj, &x->x_gp);
    else symbolinlet_new(&x->x_obj, &x->x_tc.tc_sym);
    return (x);
}